

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::changeEvent(QComboBox *this,QEvent *e)

{
  ushort uVar1;
  QComboBoxPrivate *this_00;
  Data *pDVar2;
  bool bVar3;
  QComboBoxPrivateContainer *pQVar4;
  long lVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  double dVar7;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(e + 8);
  if (uVar1 < 0x62) {
    if (uVar1 == 0x27) {
      QComboBoxPrivate::updateViewContainerPaletteAndOpacity(this_00);
    }
    else if (uVar1 == 0x61) {
      (this_00->sizeHint).wd = -1;
      (this_00->sizeHint).ht = -1;
      pQVar4 = QComboBoxPrivate::viewContainer(this_00);
      QWidget::setFont((QWidget *)pQVar4,&((this->super_QWidget).data)->fnt);
      pQVar4 = QComboBoxPrivate::viewContainer(this_00);
      (**(code **)(*(long *)&(pQVar4->view->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                  0x220))();
      if (this_00->lineEdit != (QLineEdit *)0x0) {
        QComboBoxPrivate::updateLineEditGeometry(this_00);
      }
    }
  }
  else if (uVar1 == 0x62) {
    if ((((this->super_QWidget).data)->widget_attributes & 1) != 0) {
      (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this);
    }
  }
  else if (uVar1 == 100) {
    pDVar2 = (this_00->container).wp.d;
    if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
       ((this_00->container).wp.value != (QObject *)0x0)) {
      QComboBoxPrivateContainer::updateStyleSettings
                ((QComboBoxPrivateContainer *)(this_00->container).wp.value);
    }
    QComboBoxPrivate::updateDelegate(this_00,false);
    (this_00->minimumSizeHint).wd.m_i = -1;
    (this_00->minimumSizeHint).ht.m_i = -1;
    (this_00->sizeHint).wd.m_i = -1;
    (this_00->sizeHint).ht.m_i = -1;
    QComboBoxPrivate::updateLayoutDirection(this_00);
    if (this_00->lineEdit != (QLineEdit *)0x0) {
      QComboBoxPrivate::updateLineEditGeometry(this_00);
    }
    QWidgetPrivate::setLayoutItemMargins
              (&this_00->super_QWidgetPrivate,SE_ComboBoxLayoutItem,(QStyleOption *)0x0);
    if (*(short *)(e + 8) == 0xb1) {
      bVar3 = QWidget::testAttribute_helper(&this->super_QWidget,WA_MacSmallSize);
      uVar6 = 0x15;
      if (!bVar3) {
        bVar3 = QWidget::testAttribute_helper(&this->super_QWidget,WA_MacMiniSize);
        uVar6 = 0x16;
        if (!bVar3) {
          uVar6 = 0;
        }
      }
      lVar5 = (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x58))
                        (QGuiApplicationPrivate::platform_theme,uVar6);
      if (lVar5 != 0) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        QFont::QFont((QFont *)&local_38,&((this->super_QWidget).data)->fnt);
        dVar7 = (double)QFont::pointSizeF();
        QFont::setPointSizeF(dVar7);
        QWidget::setFont(&this->super_QWidget,(QFont *)&local_38);
        QFont::~QFont((QFont *)&local_38);
      }
    }
  }
  QWidget::changeEvent(&this->super_QWidget,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::changeEvent(QEvent *e)
{
    Q_D(QComboBox);
    switch (e->type()) {
    case QEvent::StyleChange:
        if (d->container)
            d->container->updateStyleSettings();
        d->updateDelegate();

#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
#endif
        d->sizeHint = QSize(); // invalidate size hint
        d->minimumSizeHint = QSize();
        d->updateLayoutDirection();
        if (d->lineEdit)
            d->updateLineEditGeometry();
        d->setLayoutItemMargins(QStyle::SE_ComboBoxLayoutItem);

        if (e->type() == QEvent::MacSizeChange) {
            QPlatformTheme::Font f = QPlatformTheme::SystemFont;
            if (testAttribute(Qt::WA_MacSmallSize))
                f = QPlatformTheme::SmallFont;
            else if (testAttribute(Qt::WA_MacMiniSize))
                f = QPlatformTheme::MiniFont;
            if (const QFont *platformFont = QApplicationPrivate::platformTheme()->font(f)) {
                QFont f = font();
                f.setPointSizeF(platformFont->pointSizeF());
                setFont(f);
            }
        }
        // ### need to update scrollers etc. as well here
        break;
    case QEvent::EnabledChange:
        if (!isEnabled())
            hidePopup();
        break;
    case QEvent::PaletteChange: {
        d->updateViewContainerPaletteAndOpacity();
        break;
    }
    case QEvent::FontChange: {
        d->sizeHint = QSize(); // invalidate size hint
        d->viewContainer()->setFont(font());
        d->viewContainer()->itemView()->doItemsLayout();
        if (d->lineEdit)
            d->updateLineEditGeometry();
        break;
    }
    default:
        break;
    }
    QWidget::changeEvent(e);
}